

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O2

void __thiscall Chip8::Graphics::refresh(Graphics *this)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int pixel;
  long lVar7;
  SDL_Rect scaled_pixel;
  
  iVar1 = SDL_RenderClear(this->_renderer);
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[graphics] clear error: ");
    pcVar3 = (char *)SDL_GetError();
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  for (lVar7 = 0; lVar7 != 0x800; lVar7 = lVar7 + 1) {
    if (this->_gfx[lVar7] == true) {
      uVar6 = 0xff;
      uVar5 = 0xff;
      uVar4 = 0xff;
    }
    else {
      uVar6 = 0;
      uVar5 = 0;
      uVar4 = 0;
    }
    SDL_SetRenderDrawColor(this->_renderer,uVar6,uVar5,uVar4,0xff);
    SDL_RenderFillRect(this->_renderer);
  }
  this->_dirty_buffer = false;
  SDL_RenderPresent(this->_renderer);
  return;
}

Assistant:

void Graphics::refresh() {
        if (SDL_RenderClear(_renderer) != 0) {
            std::cout << "[graphics] clear error: " << SDL_GetError() << std::endl;
        }

        for (int pixel = 0; pixel < kGraphicsWidth * kGraphicsHeight; pixel++) {

            SDL_Rect scaled_pixel = {
                (pixel % kGraphicsWidth) * kGraphicsScale,
                (pixel / kGraphicsWidth) * kGraphicsScale,
                kGraphicsScale,
                kGraphicsScale
            };

            if (_gfx[pixel]) {
                SDL_SetRenderDrawColor(_renderer, 255, 255, 255, 255);
            } else {
                SDL_SetRenderDrawColor(_renderer, 0, 0, 0, 255);
            }

            SDL_RenderFillRect(_renderer, &scaled_pixel);
        }

        _dirty_buffer = false;

        SDL_RenderPresent(_renderer);
    }